

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O3

FT_ULong hash_num_lookup(FT_Hashkey *key)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = key->num;
  lVar2 = (ulong)(uVar1 >> 8 & 0xff) + ((ulong)((uVar1 & 0xff) << 5) - (ulong)(uVar1 & 0xff));
  lVar2 = (ulong)(uVar1 >> 0x10 & 0xff) + ((ulong)(uint)((int)lVar2 << 5) - lVar2);
  return (ulong)(uVar1 >> 0x18) + ((ulong)(uint)((int)lVar2 << 5) - lVar2);
}

Assistant:

static FT_ULong
  hash_num_lookup( FT_Hashkey*  key )
  {
    FT_ULong  num = (FT_ULong)key->num;
    FT_ULong  res;


    /* Mocklisp hash function. */
    res = num & 0xFF;
    res = ( res << 5 ) - res + ( ( num >>  8 ) & 0xFF );
    res = ( res << 5 ) - res + ( ( num >> 16 ) & 0xFF );
    res = ( res << 5 ) - res + ( ( num >> 24 ) & 0xFF );

    return res;
  }